

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_6_dq_string_inner(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *stuff;
  PVIPNode *pPVar1;
  
  pPVar1 = (G->data).literal_str;
  stuff = PVIP_node_new_children2(&G->data,PVIP_NODE_ATKEY,G->val[-3],G->val[-2]);
  pPVar1 = PVIP_node_append_string_node(&G->data,pPVar1,stuff);
  (G->data).literal_str = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_6_dq_string_inner(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define v G->val[-1]
#define k G->val[-2]
#define h G->val[-3]
#define e G->val[-4]
  yyprintf((stderr, "do yy_6_dq_string_inner"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {APPEND_N(CHILDREN2(PVIP_NODE_ATKEY, h, k)); }\n"));
  APPEND_N(CHILDREN2(PVIP_NODE_ATKEY, h, k)); ;
#undef v
#undef k
#undef h
#undef e
}